

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_scalar_snap(REF_NODE ref_node,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  uint64_t uVar1;
  unsigned_long uVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  __off_t _Var7;
  size_t sVar8;
  FILE *pFVar9;
  int local_290;
  int local_288;
  int local_280;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  uint64_t length;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  uint64_t count;
  uint64_t pair;
  uint64_t entry_length_uint64;
  uint64_t n_global;
  uint64_t length_remaining;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_c0;
  REF_BOOL verbose;
  REF_INT field;
  int association;
  unsigned_long uint_nnode;
  unsigned_long field_length;
  undefined1 auStack_a0 [7];
  char letter;
  uint64_t number_of_chars;
  uint64_t number_of_fields;
  uint64_t version_number;
  REF_INT version;
  REF_INT i;
  size_t end_of_string;
  REF_INT local;
  REF_INT node;
  REF_GLOB nnode;
  REF_GLOB global;
  REF_GLOB nnode_read;
  void *pvStack_50;
  REF_INT section_size;
  REF_DBL *data;
  FILE *pFStack_40;
  REF_INT chunk;
  FILE *file;
  REF_FILEPOS next_position;
  char *filename_local;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  REF_NODE ref_node_local;
  
  ref_private_status_reis_ai._4_4_ = 0;
  _local = 0xffffffffffffffff;
  file = (FILE *)0xffffffffffffffff;
  pFStack_40 = (FILE *)0x0;
  next_position = (REF_FILEPOS)filename;
  filename_local = (char *)scalar;
  scalar_local = (REF_DBL **)ldim;
  ldim_local = &ref_node->n;
  if (ref_node->ref_mpi->id == 0) {
    pFStack_40 = fopen(filename,"r");
    if (pFStack_40 == (FILE *)0x0) {
      printf("unable to open %s\n",next_position);
    }
    if (pFStack_40 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xc2a,
             "ref_part_scalar_snap","unable to open file");
      return 2;
    }
    _version = strlen((char *)next_position);
    ref_private_status_reis_bi = 0;
    iVar4 = strcmp((char *)(next_position + (_version - 5)),".snap");
    ref_private_status_reis_ai_1 = (REF_LONG)iVar4;
    if (ref_private_status_reis_bi != ref_private_status_reis_ai_1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xc2e,
             "ref_part_scalar_snap","snap extension expected",ref_private_status_reis_bi,
             ref_private_status_reis_ai_1);
      return 1;
    }
    if (ref_private_status_reis_ai._4_4_ != 0) {
      printf("read snap %s\n",next_position);
    }
    ref_private_status_reis_bi_1 = 1;
    ref_private_status_reis_ai_2 = fread(&number_of_fields,8,1,pFStack_40);
    if (ref_private_status_reis_bi_1 != ref_private_status_reis_ai_2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xc33,
             "ref_part_scalar_snap","version number",ref_private_status_reis_bi_1,
             ref_private_status_reis_ai_2);
      return 1;
    }
    if ((number_of_fields < 2) || (3 < number_of_fields)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xc35,
             "ref_part_scalar_snap","only versions 2 and 3 supported");
      return 1;
    }
    version_number._0_4_ = (int)number_of_fields;
    ref_private_status_reis_bi_2 = 1;
    _ref_private_macro_code_rss_1 = fread(&number_of_chars,8,1,pFStack_40);
    if (ref_private_status_reis_bi_2 != _ref_private_macro_code_rss_1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xc39,
             "ref_part_scalar_snap","number",ref_private_status_reis_bi_2,
             _ref_private_macro_code_rss_1);
      return 1;
    }
    *(undefined4 *)scalar_local = (undefined4)number_of_chars;
  }
  ref_private_status_reis_ai_3._4_4_ =
       ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),&version_number,1,1);
  if (ref_private_status_reis_ai_3._4_4_ == 0) {
    ref_private_status_reis_ai_3._0_4_ =
         ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),scalar_local,1,1);
    if ((uint)ref_private_status_reis_ai_3 == 0) {
      if (*(int *)scalar_local * ldim_local[1] < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xc40,"ref_part_scalar_snap","malloc *scalar of REF_DBL negative");
        ref_node_local._4_4_ = 1;
      }
      else {
        pvVar6 = malloc((long)(*(int *)scalar_local * ldim_local[1]) << 3);
        *(void **)filename_local = pvVar6;
        if (*(long *)filename_local == 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xc40,"ref_part_scalar_snap","malloc *scalar of REF_DBL NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          for (local_c0 = 0; local_c0 < *(int *)scalar_local; local_c0 = local_c0 + 1) {
            if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
              if ((int)version_number == 2) {
                ref_private_status_reis_bi_3 = 1;
                ref_private_status_reis_ai_4 = fread(auStack_a0,8,1,pFStack_40);
                if (ref_private_status_reis_bi_3 != ref_private_status_reis_ai_4) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc46,"ref_part_scalar_snap","number",ref_private_status_reis_bi_3,
                         ref_private_status_reis_ai_4);
                  return 1;
                }
                for (version_number._4_4_ = 0; version_number._4_4_ < (int)_auStack_a0;
                    version_number._4_4_ = version_number._4_4_ + 1) {
                  ref_private_status_reis_bi_4 = 1;
                  ref_private_status_reis_ai_5 =
                       fread((void *)((long)&field_length + 7),1,1,pFStack_40);
                  if (ref_private_status_reis_bi_4 != ref_private_status_reis_ai_5) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xc48,"ref_part_scalar_snap","number",ref_private_status_reis_bi_4,
                           ref_private_status_reis_ai_5);
                    return 1;
                  }
                }
                ref_private_status_reis_bi_5 = 1;
                ref_private_status_reis_ai_6 = fread(&uint_nnode,8,1,pFStack_40);
                uVar2 = uint_nnode;
                if (ref_private_status_reis_bi_5 != ref_private_status_reis_ai_6) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc4a,"ref_part_scalar_snap","number",ref_private_status_reis_bi_5,
                         ref_private_status_reis_ai_6);
                  return 1;
                }
                _Var7 = ftello(pFStack_40);
                file = (FILE *)(uVar2 + _Var7);
                ref_private_status_reis_bi_6 = 1;
                ref_private_status_reis_ai_7 = fread(&field,8,1,pFStack_40);
                if (ref_private_status_reis_bi_6 != ref_private_status_reis_ai_7) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc4c,"ref_part_scalar_snap","number",ref_private_status_reis_bi_6,
                         ref_private_status_reis_ai_7);
                  return 1;
                }
                _local = _field;
                ref_private_status_reis_bi_7 = 1;
                ref_private_status_reis_ai_8 = fread(&verbose,4,1,pFStack_40);
                if (ref_private_status_reis_bi_7 != ref_private_status_reis_ai_8) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc4e,"ref_part_scalar_snap","number",ref_private_status_reis_bi_7,
                         ref_private_status_reis_ai_8);
                  return 1;
                }
                ref_private_status_reis_bi_8 = -1;
                length_remaining = (uint64_t)verbose;
                if (length_remaining != 0xffffffffffffffff) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc4f,"ref_part_scalar_snap","field node association only",
                         0xffffffffffffffff,length_remaining);
                  return 1;
                }
                length_remaining = 0xffffffffffffffff;
              }
              else {
                ref_private_status_reis_bi_9 = 1;
                ref_private_status_reis_ai_10 = fread(&n_global,8,1,pFStack_40);
                uVar1 = n_global;
                if (ref_private_status_reis_bi_9 != ref_private_status_reis_ai_10) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc57,"ref_part_scalar_snap","length_remaining",
                         ref_private_status_reis_bi_9,ref_private_status_reis_ai_10);
                  return 1;
                }
                _Var7 = ftello(pFStack_40);
                file = (FILE *)(uVar1 + _Var7);
                ref_private_status_reis_bi_10 = 1;
                ref_private_status_reis_ai_11 = fread(&entry_length_uint64,8,1,pFStack_40);
                if (ref_private_status_reis_bi_10 != ref_private_status_reis_ai_11) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc59,"ref_part_scalar_snap","n_global",ref_private_status_reis_bi_10,
                         ref_private_status_reis_ai_11);
                  return 1;
                }
                ref_private_status_reis_bi_11 = 1;
                ref_private_status_reis_ai_12 = fread(&pair,8,1,pFStack_40);
                if (ref_private_status_reis_bi_11 != ref_private_status_reis_ai_12) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc5c,"ref_part_scalar_snap","entry_length_uint64",
                         ref_private_status_reis_bi_11,ref_private_status_reis_ai_12);
                  return 1;
                }
                _local = entry_length_uint64;
                ref_private_status_reis_bi_12 = 1;
                ref_private_status_reis_ai_13 = pair;
                if (pair != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc5e,"ref_part_scalar_snap","require entry_length == 1",1,pair);
                  return 1;
                }
                ref_private_status_reis_bi_13 = 1;
                length = fread(&ref_private_status_reis_ai_9,8,1,pFStack_40);
                if (ref_private_status_reis_bi_13 != length) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc60,"ref_part_scalar_snap","count",ref_private_status_reis_bi_13,length)
                  ;
                  return 1;
                }
                for (count = 0; count < (ulong)ref_private_status_reis_ai_9; count = count + 1) {
                  sVar8 = fread(&ref_private_status_reis_ai_14,8,1,pFStack_40);
                  if (sVar8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xc64,"ref_part_scalar_snap","length",1,sVar8);
                    return 1;
                  }
                  for (version_number._4_4_ = 0;
                      version_number._4_4_ < (int)ref_private_status_reis_ai_14;
                      version_number._4_4_ = version_number._4_4_ + 1) {
                    sVar8 = fread((void *)((long)&field_length + 7),1,1,pFStack_40);
                    if (sVar8 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xc66,"ref_part_scalar_snap","number",1,sVar8);
                      return 1;
                    }
                  }
                  sVar8 = fread(&ref_private_status_reis_ai_14,8,1,pFStack_40);
                  if (sVar8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xc69,"ref_part_scalar_snap","length",1,sVar8);
                    return 1;
                  }
                  for (version_number._4_4_ = 0;
                      version_number._4_4_ < (int)ref_private_status_reis_ai_14;
                      version_number._4_4_ = version_number._4_4_ + 1) {
                    sVar8 = fread((void *)((long)&field_length + 7),1,1,pFStack_40);
                    if (sVar8 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xc6b,"ref_part_scalar_snap","number",1,sVar8);
                      return 1;
                    }
                  }
                }
              }
              if (ref_private_status_reis_ai._4_4_ != 0) {
                printf("file nnode %ld ref nnode %ld\n",_local,*(undefined8 *)(ldim_local + 0x1a));
              }
              if ((_local != *(uint64_t *)(ldim_local + 0x1a)) &&
                 ((long)_local / 2 != *(long *)(ldim_local + 0x1a))) {
                printf("file %ld ref_node %ld\n",_local,*(undefined8 *)(ldim_local + 0x1a));
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc78,"ref_part_scalar_snap","global count mismatch");
                return 1;
              }
            }
            uVar5 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),&local,1,1);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xc7c,"ref_part_scalar_snap",(ulong)uVar5,"bcast ldim");
              return uVar5;
            }
            if ((long)_local / (long)**(int **)(ldim_local + 0x14) < 100000) {
              local_280 = 100000;
            }
            else {
              local_280 = (int)((long)_local / (long)**(int **)(ldim_local + 0x14));
            }
            if ((long)local_280 < (long)_local) {
              local_288 = local_280;
            }
            else {
              local_288 = (int)_local;
            }
            data._4_4_ = local_288;
            if (local_288 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xc81,"ref_part_scalar_snap","malloc data of REF_DBL negative");
              return 1;
            }
            pvStack_50 = malloc((long)local_288 << 3);
            if (pvStack_50 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xc81,"ref_part_scalar_snap","malloc data of REF_DBL NULL");
              return 2;
            }
            for (ref_private_status_reis_ai_18._0_4_ = 0;
                (int)ref_private_status_reis_ai_18 < data._4_4_;
                ref_private_status_reis_ai_18._0_4_ = (int)ref_private_status_reis_ai_18 + 1) {
              *(undefined8 *)((long)pvStack_50 + (long)(int)ref_private_status_reis_ai_18 * 8) =
                   0xbff0000000000000;
            }
            for (global = 0; global < (long)_local; global = nnode_read._4_4_ + global) {
              if (ref_private_status_reis_ai._4_4_ != 0) {
                printf("nnode %ld read %ld\n",_local,global);
              }
              if ((long)data._4_4_ < (long)(_local - global)) {
                local_290 = data._4_4_;
              }
              else {
                local_290 = (int)_local - (int)global;
              }
              nnode_read._4_4_ = local_290;
              if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
                sVar8 = fread(pvStack_50,8,(long)local_290,pFStack_40);
                if ((long)local_290 != sVar8) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc8c,"ref_part_scalar_snap","dat",(long)local_290,sVar8);
                  return 1;
                }
                uVar5 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_50,data._4_4_,3);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc8e,"ref_part_scalar_snap",(ulong)uVar5,"bcast");
                  return uVar5;
                }
              }
              else {
                uVar5 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_50,data._4_4_,3);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc91,"ref_part_scalar_snap",(ulong)uVar5,"bcast");
                  return uVar5;
                }
              }
              for (end_of_string._4_4_ = 0; end_of_string._4_4_ < nnode_read._4_4_;
                  end_of_string._4_4_ = end_of_string._4_4_ + 1) {
                nnode = end_of_string._4_4_ + global;
                uVar5 = ::ref_node_local((REF_NODE)ldim_local,nnode,(REF_INT *)&end_of_string);
                if ((uVar5 != 0) && (uVar5 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xc95,"ref_part_scalar_snap",(ulong)uVar5,"local");
                  return uVar5;
                }
                if ((int)end_of_string != -1) {
                  *(undefined8 *)
                   (*(long *)filename_local +
                   (long)(local_c0 + (int)end_of_string * *(int *)scalar_local) * 8) =
                       *(undefined8 *)((long)pvStack_50 + (long)end_of_string._4_4_ * 8);
                }
              }
            }
            if (pvStack_50 != (void *)0x0) {
              free(pvStack_50);
            }
            pFVar3 = file;
            if (((*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) &&
                (_local == *(uint64_t *)(ldim_local + 0x1a))) &&
               (pFVar9 = (FILE *)ftello(pFStack_40), pFVar3 != pFVar9)) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xca1,"ref_part_scalar_snap","end location",pFVar3,pFVar9);
              return 1;
            }
          }
          if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
            iVar4 = fclose(pFStack_40);
            if ((long)iVar4 != 0) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xca6,"ref_part_scalar_snap","close file",0,(long)iVar4);
              return 1;
            }
          }
          ref_node_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xc3f,
             "ref_part_scalar_snap",(ulong)(uint)ref_private_status_reis_ai_3,"bcast ldim");
      ref_node_local._4_4_ = (uint)ref_private_status_reis_ai_3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xc3d,
           "ref_part_scalar_snap",(ulong)ref_private_status_reis_ai_3._4_4_,"bcast ldim");
    ref_node_local._4_4_ = ref_private_status_reis_ai_3._4_4_;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_scalar_snap(REF_NODE ref_node, REF_INT *ldim,
                                               REF_DBL **scalar,
                                               const char *filename) {
  REF_FILEPOS next_position;
  FILE *file;
  REF_INT chunk;
  REF_DBL *data;
  REF_INT section_size;
  REF_GLOB nnode_read, global, nnode;
  REF_INT node, local;
  size_t end_of_string;
  REF_INT i;
  REF_INT version;
  uint64_t version_number;
  uint64_t number_of_fields;
  uint64_t number_of_chars;
  char letter;
  unsigned long field_length, uint_nnode;
  int association;
  REF_INT field;
  REF_BOOL verbose = REF_FALSE;

  nnode = -1;
  next_position = -1;
  file = NULL;
  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    REIS(0, strcmp(&filename[end_of_string - 5], ".snap"),
         "snap extension expected");

    if (verbose) printf("read snap %s\n", filename);

    REIS(1, fread(&version_number, sizeof(version_number), 1, file),
         "version number");
    RAS(2 <= version_number && version_number <= 3,
        "only versions 2 and 3 supported");
    version = (REF_INT)version_number;

    REIS(1, fread(&number_of_fields, sizeof(number_of_fields), 1, file),
         "number");
    *ldim = (REF_INT)number_of_fields;
  }
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &version, 1, REF_INT_TYPE),
      "bcast ldim");
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), ldim, 1, REF_INT_TYPE),
      "bcast ldim");
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  for (field = 0; field < (*ldim); field++) {
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      if (2 == version) {
        REIS(1, fread(&number_of_chars, sizeof(number_of_chars), 1, file),
             "number");
        for (i = 0; i < (REF_INT)number_of_chars; i++) {
          REIS(1, fread(&letter, sizeof(letter), 1, file), "number");
        }
        REIS(1, fread(&field_length, sizeof(field_length), 1, file), "number");
        next_position = (REF_FILEPOS)field_length + ftello(file);
        REIS(1, fread(&uint_nnode, sizeof(uint_nnode), 1, file), "number");
        nnode = (REF_GLOB)uint_nnode;
        REIS(1, fread(&association, sizeof(association), 1, file), "number");
        REIS(-1, association, "field node association only");
      } else {
        uint64_t length_remaining;
        uint64_t n_global;
        uint64_t entry_length_uint64;
        uint64_t pair;
        uint64_t count;
        REIS(1, fread(&length_remaining, sizeof(length_remaining), 1, file),
             "length_remaining");
        next_position = (REF_FILEPOS)length_remaining + ftello(file);
        REIS(1, fread(&n_global, sizeof(n_global), 1, file), "n_global");
        REIS(1,
             fread(&entry_length_uint64, sizeof(entry_length_uint64), 1, file),
             "entry_length_uint64");
        nnode = (REF_GLOB)n_global;
        REIS(1, entry_length_uint64, "require entry_length == 1");

        REIS(1, fread(&count, sizeof(count), 1, file), "count");
        for (pair = 0; pair < count; pair++) {
          uint64_t length;
          /* key */
          REIS(1, fread(&length, sizeof(length), 1, file), "length");
          for (i = 0; i < (REF_INT)length; i++) {
            REIS(1, fread(&letter, sizeof(letter), 1, file), "number");
          }
          /* value */
          REIS(1, fread(&length, sizeof(length), 1, file), "length");
          for (i = 0; i < (REF_INT)length; i++) {
            REIS(1, fread(&letter, sizeof(letter), 1, file), "number");
          }
        }
      }

      if (verbose)
        printf("file nnode %ld ref nnode " REF_GLOB_FMT "\n", nnode,
               ref_node_n_global(ref_node));

      if ((nnode != ref_node_n_global(ref_node)) &&
          (nnode / 2 != ref_node_n_global(ref_node))) {
        printf("file " REF_GLOB_FMT " ref_node " REF_GLOB_FMT "\n", nnode,
               ref_node_n_global(ref_node));
        THROW("global count mismatch");
      }
    }
    RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &nnode, 1, REF_INT_TYPE),
        "bcast ldim");

    chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_node_mpi(ref_node)));
    chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

    ref_malloc_init(data, chunk, REF_DBL, -1.0);

    nnode_read = 0;
    while (nnode_read < nnode) {
      if (verbose)
        printf("nnode " REF_GLOB_FMT " read " REF_GLOB_FMT "\n", nnode,
               nnode_read);

      section_size = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_read);
      if (ref_mpi_once(ref_node_mpi(ref_node))) {
        REIS(section_size,
             fread(data, sizeof(REF_DBL), (size_t)(section_size), file), "dat");
        RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, chunk, REF_DBL_TYPE),
            "bcast");
      } else {
        RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, chunk, REF_DBL_TYPE),
            "bcast");
      }
      for (node = 0; node < section_size; node++) {
        global = node + nnode_read;
        RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          (*scalar)[field + local * (*ldim)] = data[node];
        }
      }
      nnode_read += section_size;
    }

    ref_free(data);

    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      if (nnode == ref_node_n_global(ref_node))
        REIS(next_position, ftello(file), "end location");
    }
  }

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    REIS(0, fclose(file), "close file");
  }

  return REF_SUCCESS;
}